

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::EnumValueDescriptor>
          (DescriptorBuilder *this,string *name_scope,string *element_name,OptionsType *orig_options
          ,EnumValueDescriptor *descriptor,vector<int,_std::allocator<int>_> *options_path)

{
  bool bVar1;
  int iVar2;
  Tables *in_RDI;
  long in_R8;
  OptionsType *options;
  OptionsType *dummy;
  EnumValueOptions *in_stack_fffffffffffffeb8;
  value_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  OptionsToInterpret *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  EnumValueOptions *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff20;
  ErrorLocation in_stack_ffffffffffffff2c;
  Message *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  DescriptorBuilder *in_stack_ffffffffffffff40;
  string local_b0 [48];
  string local_80 [32];
  string local_60 [32];
  EnumValueOptions *local_40;
  undefined8 local_38;
  long local_28;
  
  local_38 = 0;
  local_28 = in_R8;
  local_40 = DescriptorPool::Tables::AllocateMessage<google::protobuf::EnumValueOptions>
                       (in_RDI,in_stack_fffffffffffffed8);
  bVar1 = EnumValueOptions::IsInitialized(in_stack_fffffffffffffeb8);
  if (bVar1) {
    MessageLite::SerializeAsString_abi_cxx11_((MessageLite *)in_stack_fffffffffffffee8);
    MessageLite::ParseFromString
              ((MessageLite *)in_stack_fffffffffffffec0,(string *)in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_b0);
    *(EnumValueOptions **)(local_28 + 0x20) = local_40;
    iVar2 = EnumValueOptions::uninterpreted_option_size((EnumValueOptions *)0x50303d);
    if (0 < iVar2) {
      __x = (value_type *)&in_RDI->known_bad_files_;
      this_00 = (OptionsToInterpret *)&stack0xfffffffffffffee8;
      anon_unknown_1::OptionsToInterpret::OptionsToInterpret
                ((OptionsToInterpret *)in_stack_ffffffffffffff00,(string *)in_stack_fffffffffffffef8
                 ,in_stack_fffffffffffffef0,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8,(Message *)in_RDI,
                 &in_stack_fffffffffffffed8->super_Message);
      std::
      vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ::push_back((vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                   *)this_00,__x);
      anon_unknown_1::OptionsToInterpret::~OptionsToInterpret(this_00);
    }
  }
  else {
    std::operator+(in_stack_fffffffffffffee8,(char *)in_RDI);
    std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    AddError(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff2c,(char *)in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
  }
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptionsImpl(
    const std::string& name_scope, const std::string& element_name,
    const typename DescriptorT::OptionsType& orig_options,
    DescriptorT* descriptor, const std::vector<int>& options_path) {
  // We need to use a dummy pointer to work around a bug in older versions of
  // GCC.  Otherwise, the following two lines could be replaced with:
  //   typename DescriptorT::OptionsType* options =
  //       tables_->AllocateMessage<typename DescriptorT::OptionsType>();
  typename DescriptorT::OptionsType* const dummy = nullptr;
  typename DescriptorT::OptionsType* options = tables_->AllocateMessage(dummy);

  if (!orig_options.IsInitialized()) {
    AddError(name_scope + "." + element_name, orig_options,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    return;
  }

  // Avoid using MergeFrom()/CopyFrom() in this class to make it -fno-rtti
  // friendly. Without RTTI, MergeFrom() and CopyFrom() will fallback to the
  // reflection based method, which requires the Descriptor. However, we are in
  // the middle of building the descriptors, thus the deadlock.
  options->ParseFromString(orig_options.SerializeAsString());
  descriptor->options_ = options;

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(OptionsToInterpret(
        name_scope, element_name, options_path, &orig_options, options));
  }
}